

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *r_00;
  long lVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  secp256k1_scalar sVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  secp256k1_scalar *b;
  secp256k1_gej *r_01;
  ulong uVar13;
  secp256k1_ge *r_02;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  secp256k1_fe zz;
  int iStack_1c4;
  secp256k1_scalar sStack_164;
  undefined1 auStack_160 [16];
  undefined1 auStack_150 [16];
  undefined1 auStack_140 [16];
  undefined1 auStack_130 [16];
  undefined1 auStack_120 [16];
  undefined1 auStack_110 [16];
  uint64_t uStack_100;
  undefined8 uStack_f8;
  secp256k1_ge sStack_f0;
  secp256k1_gej *psStack_88;
  undefined8 uStack_80;
  secp256k1_fe local_50;
  
  secp256k1_gej_verify(r);
  secp256k1_fe_verify(s);
  secp256k1_fe_verify(s);
  uVar8 = (s->n[4] >> 0x30) * 0x1000003d1 + s->n[0];
  if (((uVar8 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar8 & 0xfffffffffffff) == 0)) {
    uVar12 = (uVar8 >> 0x34) + s->n[1];
    r_01 = (secp256k1_gej *)((uVar12 >> 0x34) + s->n[2]);
    uVar13 = ((ulong)r_01 >> 0x34) + s->n[3];
    uVar14 = (uVar13 >> 0x34) + (s->n[4] & 0xffffffffffff);
    if ((((uVar12 | uVar8 | (ulong)r_01 | uVar13) & 0xfffffffffffff) == 0 && uVar14 == 0) ||
       (((uVar8 | 0x1000003d0) & uVar12 & (ulong)r_01 & uVar13 & (uVar14 ^ 0xf000000000000)) ==
        0xfffffffffffff)) {
      secp256k1_gej_rescale_cold_1();
      uStack_80 = 0x1000003d0;
      auStack_160 = (undefined1  [16])0x0;
      auStack_150 = (undefined1  [16])0x0;
      auStack_140 = (undefined1  [16])0x0;
      auStack_130 = (undefined1  [16])0x0;
      psStack_88 = r;
      secp256k1_scalar_add(&sStack_164,(secp256k1_scalar *)(uVar13 + 4),b);
      secp256k1_scalar_verify(&sStack_164);
      sVar6 = sStack_164;
      sStack_164 = 0;
      bVar5 = true;
      iStack_1c4 = 1;
      while( true ) {
        r_02 = &sStack_f0;
        iVar7 = 0;
        uVar10 = 0;
        iVar11 = iStack_1c4;
        do {
          bVar4 = (byte)iVar11 & 0x1f;
          bVar2 = (byte)iVar7 & 0x1f;
          uVar10 = (sVar6 >> bVar4 | sVar6 << 0x20 - bVar4) << ((byte)iVar7 & 0x1f) ^
                   uVar10 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
          iVar11 = iVar11 + 2;
          iVar7 = iVar7 + 1;
        } while (iVar7 == 1);
        uVar8 = 0;
        do {
          uVar15 = (uint)(((uVar10 ^ uVar10 >> 1) & 1) << 6 == uVar8);
          uVar14 = (ulong)((long)r_02 << 3) >> 0x33;
          uVar3 = (((long)r_02 << 3 | (ulong)r_02 >> 0x3d) << 0xd | uVar14) >> 3;
          uVar12 = uVar3 << 0x33;
          lVar1 = (long)(int)uVar15 + -1;
          lVar9 = -(long)(int)uVar15;
          auVar17._8_4_ = (int)lVar1;
          auVar17._0_8_ = lVar1;
          auVar17._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar19._8_4_ = (int)lVar9;
          auVar19._0_8_ = lVar9;
          auVar19._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auStack_160 = *(undefined1 (*) [16])
                         ((long)secp256k1_ecmult_gen_prec_table[0][0].x.n + uVar8) & auVar19 |
                        auStack_160 & auVar17;
          auStack_150 = auVar19 & *(undefined1 (*) [16])
                                   ((long)secp256k1_ecmult_gen_prec_table[0][0].x.n + uVar8 + 0x10)
                        | auVar17 & auStack_150;
          uVar14 = (uVar12 | (uVar14 << 0x3d | uVar3) >> 0xd) << 3;
          uVar3 = uVar14 >> 0x33;
          uVar12 = ((uVar14 | uVar12 >> 0x3d) << 0xd | uVar3) >> 3;
          r_02 = (secp256k1_ge *)(uVar12 << 0x33 | (uVar3 << 0x3d | uVar12) >> 0xd);
          lVar1 = (long)(int)uVar15 + -1;
          lVar9 = -(long)(int)uVar15;
          auVar18._8_4_ = (int)lVar1;
          auVar18._0_8_ = lVar1;
          auVar18._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar20._8_4_ = (int)lVar9;
          auVar20._0_8_ = lVar9;
          auVar20._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auStack_140 = *(undefined1 (*) [16])
                         ((long)secp256k1_ecmult_gen_prec_table[0][0].y.n + uVar8) & auVar20 |
                        auStack_140 & auVar18;
          auStack_130 = auVar20 & *(undefined1 (*) [16])
                                   ((long)secp256k1_ecmult_gen_prec_table[0][0].y.n + uVar8 + 0x10)
                        | auVar18 & auStack_130;
          uVar8 = uVar8 + 0x40;
        } while (uVar8 == 0x40);
        secp256k1_ge_from_storage(r_02,(secp256k1_ge_storage *)auStack_160);
        secp256k1_fe_verify(&sStack_f0.y);
        secp256k1_fe_verify_magnitude(&sStack_f0.y,1);
        auStack_120._8_8_ = 0x3ffffffffffffc - sStack_f0.y.n[1];
        auStack_120._0_8_ = 0x3ffffbfffff0bc - sStack_f0.y.n[0];
        auStack_110._8_8_ = 0x3ffffffffffffc - sStack_f0.y.n[3];
        auStack_110._0_8_ = 0x3ffffffffffffc - sStack_f0.y.n[2];
        uStack_100 = 0x3fffffffffffc - sStack_f0.y.n[4];
        uStack_f8._0_4_ = 2;
        uStack_f8._4_4_ = 0;
        secp256k1_fe_verify((secp256k1_fe *)auStack_120);
        secp256k1_fe_cmov(&sStack_f0.y,(secp256k1_fe *)auStack_120,uVar10 >> 1 & 1);
        if (bVar5) {
          secp256k1_gej_set_ge(r_01,&sStack_f0);
          secp256k1_gej_rescale(r_01,(secp256k1_fe *)(uVar13 + 0x70));
          bVar5 = false;
        }
        else {
          secp256k1_gej_add_ge(r_01,r_01,&sStack_f0);
        }
        bVar16 = iStack_1c4 == 0;
        iStack_1c4 = iStack_1c4 + -1;
        if (bVar16) break;
        secp256k1_gej_double(r_01,r_01);
      }
      secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)(uVar13 + 8));
      uStack_f8._0_4_ = 0;
      uStack_f8._4_4_ = 1;
      auStack_120 = (undefined1  [16])0x0;
      auStack_110 = (undefined1  [16])0x0;
      uStack_100 = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_120);
      secp256k1_ge_clear(&sStack_f0);
      return;
    }
  }
  secp256k1_fe_sqr(&local_50,s);
  secp256k1_fe_mul(&r->x,&r->x,&local_50);
  r_00 = &r->y;
  secp256k1_fe_mul(r_00,r_00,&local_50);
  secp256k1_fe_mul(r_00,r_00,s);
  secp256k1_fe_mul(&r->z,&r->z,s);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}